

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_CEException.cpp
# Opt level: O0

bool __thiscall test_CEException::test_sofa_exception(test_CEException *this)

{
  undefined8 uVar1;
  sofa_exception *e;
  allocator local_89;
  string local_88 [16];
  string *in_stack_ffffffffffffff88;
  string *in_stack_ffffffffffffff90;
  string *in_stack_ffffffffffffff98;
  sofa_exception *in_stack_ffffffffffffffa0;
  allocator local_29;
  string local_28 [40];
  
  uVar1 = __cxa_allocate_exception(0xa8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_28,"test_CEException::test_sofa_exception()",&local_29);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&stack0xffffffffffffffa0,"No method currently checked",
             (allocator *)&stack0xffffffffffffff9f);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_88,"Testing throwing \'CEException::sofa_exception\'",&local_89);
  CEException::sofa_exception::sofa_exception
            (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,
             in_stack_ffffffffffffff88);
  __cxa_throw(uVar1,&CEException::sofa_exception::typeinfo,
              CEException::sofa_exception::~sofa_exception);
}

Assistant:

bool test_CEException::test_sofa_exception(void)
{
    // Try throwing
    try {
        // TODO: find a sofa method that can be configured to return a bad error code
        throw CEException::sofa_exception("test_CEException::test_sofa_exception()",
                                      "No method currently checked",
                                      "Testing throwing 'CEException::sofa_exception'");
        // If we get here there's a problem
        log_failure("CEException::sofa_exception failed to throw", __func__, __LINE__);
        update_pass(false);
    } catch (CEException::sofa_exception & e) {
        // This is where we should be
        log_success("CEException::sofa_exception thrown successfully", __func__, __LINE__);
        update_pass(true);
    }

    return pass();
}